

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O3

void __thiscall
qclab::qgates::SWAP<std::complex<double>_>::apply
          (SWAP<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281_conflict2 f;
  int *local_40 [2];
  long local_30;
  anon_class_8_1_703dd281_conflict2 local_28;
  
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [5])(local_40,this);
  iVar1 = *local_40[0];
  *local_40[0] = iVar1 + offset;
  iVar2 = local_40[0][1];
  local_40[0][1] = offset + iVar2;
  local_28.vector =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  apply4bc<qclab::qgates::lambda_SWAP<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_28);
  if (local_40[0] != (int *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
  }
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }